

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O1

void draw_shape(element_t *element,render_context_t *context,render_state_t *state)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  plutovg_canvas_t *ppVar4;
  long lVar5;
  length_type_t lVar6;
  paint_type_t pVar7;
  ulong uVar8;
  _Bool _Var9;
  int iVar10;
  char *it_1;
  attribute *paVar11;
  byte *pbVar12;
  char *pcVar13;
  plutovg_fill_rule_t winding;
  size_t sVar14;
  long lVar15;
  plutovg_line_join_t line_join;
  string_t *psVar16;
  string_t *unaff_R13;
  string_t *psVar17;
  length_t *length;
  ulong uVar18;
  element_t *peVar19;
  render_context_t *prVar20;
  byte *end;
  bool bVar21;
  float fVar22;
  float fVar23;
  float miter_limit;
  length_t stroke_width;
  float stroke_opacity;
  length_t dash_offset;
  paint_t stroke;
  paint_t fill;
  float dashes [128];
  float fill_opacity;
  plutovg_line_cap_t local_6a0;
  float local_69c;
  render_context_t *local_698;
  length_t local_690;
  float local_684;
  length_t local_680;
  paint_t local_678;
  paint_t local_658;
  byte *local_638 [64];
  length_t local_438 [128];
  ulong local_38;
  
  local_678.id.data = (char *)0x0;
  local_678.id.length = 0;
  local_678.type = paint_type_none;
  local_678.color.type = color_type_fixed;
  local_678.color.value = 0;
  local_678._12_4_ = 0;
  local_698 = context;
  parse_paint(element,0x1d,&local_678);
  local_690.value = 1.0;
  local_690.type = length_type_fixed;
  local_69c = 4.0;
  pVar7 = local_678.type;
  if (local_678.type == paint_type_none) {
    local_6a0 = PLUTOVG_LINE_CAP_BUTT;
    psVar16 = (string_t *)0x0;
    prVar20 = local_698;
  }
  else {
    parse_length(element,0x24,&local_690,false,true);
    psVar16 = (string_t *)0x100000000;
    peVar19 = element;
    do {
      psVar17 = psVar16;
      for (paVar11 = peVar19->attributes; psVar16 = psVar17, paVar11 != (attribute *)0x0;
          paVar11 = paVar11->next) {
        if (paVar11->id == 0x20) {
          if (((paVar11->value).length == 7) &&
             (iVar10 = strncmp((paVar11->value).data,"inherit",7), iVar10 == 0)) {
            bVar21 = true;
          }
          else {
            bVar21 = false;
            psVar17 = &paVar11->value;
          }
          unaff_R13 = psVar17;
          psVar16 = psVar17;
          if (!bVar21) {
            bVar21 = false;
            goto LAB_00107d2e;
          }
          break;
        }
      }
      psVar17 = unaff_R13;
      peVar19 = peVar19->parent;
      bVar21 = true;
LAB_00107d2e:
      if (!bVar21) goto LAB_00107d5f;
      unaff_R13 = psVar17;
    } while (peVar19 != (element_t *)0x0);
    psVar16 = (string_t *)0x0;
LAB_00107d5f:
    peVar19 = element;
    local_6a0 = PLUTOVG_LINE_CAP_BUTT;
    if (psVar16 != (string_t *)0x0) {
      pcVar2 = psVar16->data;
      sVar3 = psVar16->length;
      pcVar1 = pcVar2 + sVar3;
      if ((long)sVar3 < 1) {
        pcVar13 = "butt";
      }
      else {
        sVar14 = 0;
        do {
          pcVar13 = "";
          if (sVar14 == 4) break;
          if (pcVar2[sVar14] != "butt"[sVar14]) {
            pcVar13 = "butt" + sVar14;
            break;
          }
          sVar14 = sVar14 + 1;
          pcVar13 = "butt" + sVar3;
        } while (sVar3 != sVar14);
      }
      local_6a0 = PLUTOVG_LINE_CAP_BUTT;
      if (*pcVar13 != '\0') {
        if (pcVar2 < pcVar1) {
          lVar15 = 0;
          do {
            pcVar13 = "";
            if (lVar15 == 5) break;
            if (pcVar2[lVar15] != "round"[lVar15]) {
              pcVar13 = "round" + lVar15;
              break;
            }
            lVar5 = lVar15 + 1;
            lVar15 = lVar15 + 1;
            pcVar13 = "round" + ((long)pcVar1 - (long)pcVar2);
          } while (pcVar2 + lVar5 != pcVar1);
        }
        else {
          pcVar13 = "round";
        }
        if (*pcVar13 == '\0') {
          local_6a0 = PLUTOVG_LINE_CAP_ROUND;
        }
        else {
          if (pcVar2 < pcVar1) {
            lVar15 = 0;
            do {
              pcVar13 = "";
              if (lVar15 == 6) break;
              if (pcVar2[lVar15] != "square"[lVar15]) {
                pcVar13 = "square" + lVar15;
                break;
              }
              lVar5 = lVar15 + 1;
              lVar15 = lVar15 + 1;
              pcVar13 = "square" + ((long)pcVar1 - (long)pcVar2);
            } while (pcVar2 + lVar5 != pcVar1);
          }
          else {
            pcVar13 = "square";
          }
          local_6a0 = (uint)(*pcVar13 == '\0') * 2;
        }
      }
    }
    do {
      for (paVar11 = peVar19->attributes; paVar11 != (attribute *)0x0; paVar11 = paVar11->next) {
        if (paVar11->id == 0x21) {
          if (((paVar11->value).length == 7) &&
             (iVar10 = strncmp((paVar11->value).data,"inherit",7), iVar10 == 0)) {
            bVar21 = true;
          }
          else {
            bVar21 = false;
            psVar17 = &paVar11->value;
          }
          if (!bVar21) {
            bVar21 = false;
            goto LAB_00107efc;
          }
          break;
        }
      }
      peVar19 = peVar19->parent;
      bVar21 = true;
LAB_00107efc:
      prVar20 = local_698;
      if (!bVar21) goto LAB_00107f18;
    } while (peVar19 != (element_t *)0x0);
    psVar17 = (string_t *)0x0;
LAB_00107f18:
    psVar16 = (string_t *)0x0;
    if (psVar17 != (string_t *)0x0) {
      pcVar2 = psVar17->data;
      sVar3 = psVar17->length;
      pcVar1 = pcVar2 + sVar3;
      if ((long)sVar3 < 1) {
        pcVar13 = "miter";
      }
      else {
        sVar14 = 0;
        do {
          pcVar13 = "";
          if (sVar14 == 5) break;
          if (pcVar2[sVar14] != "miter"[sVar14]) {
            pcVar13 = "miter" + sVar14;
            break;
          }
          sVar14 = sVar14 + 1;
          pcVar13 = "miter" + sVar3;
        } while (sVar3 != sVar14);
      }
      if (*pcVar13 != '\0') {
        if (pcVar2 < pcVar1) {
          lVar15 = 0;
          do {
            pcVar13 = "";
            if (lVar15 == 5) break;
            if (pcVar2[lVar15] != "round"[lVar15]) {
              pcVar13 = "round" + lVar15;
              break;
            }
            lVar5 = lVar15 + 1;
            lVar15 = lVar15 + 1;
            pcVar13 = "round" + ((long)pcVar1 - (long)pcVar2);
          } while (pcVar2 + lVar5 != pcVar1);
        }
        else {
          pcVar13 = "round";
        }
        if (*pcVar13 == '\0') {
          psVar16 = (string_t *)0x1;
        }
        else {
          if (pcVar2 < pcVar1) {
            lVar15 = 0;
            do {
              pcVar13 = "";
              if (lVar15 == 5) break;
              if (pcVar2[lVar15] != "bevel"[lVar15]) {
                pcVar13 = "bevel" + lVar15;
                break;
              }
              lVar5 = lVar15 + 1;
              lVar15 = lVar15 + 1;
              pcVar13 = "bevel" + ((long)pcVar1 - (long)pcVar2);
            } while (pcVar2 + lVar5 != pcVar1);
          }
          else {
            pcVar13 = "bevel";
          }
          psVar16 = (string_t *)(ulong)((uint)(*pcVar13 == '\0') * 2);
        }
      }
    }
    parse_number(element,0x22,&local_69c,false,true);
  }
  line_join = (plutovg_line_join_t)psVar16;
  if (state->mode == render_mode_bounding) {
    if (pVar7 != paint_type_none) {
      lVar6 = local_690.type;
      fVar22 = 0.0;
      if (local_690.type == length_type_percent) {
        fVar22 = hypotf(state->view_width,state->view_height);
        fVar22 = fVar22 / 1.4142135;
      }
      if (lVar6 == length_type_percent) {
        local_690.value = (fVar22 * local_690.value) / 100.0;
      }
      local_690.value = local_690.value * 0.5;
      fVar22 = local_690.value;
      if (local_6a0 == PLUTOVG_LINE_CAP_SQUARE) {
        fVar22 = local_690.value * 1.4142135;
      }
      if (line_join == PLUTOVG_LINE_JOIN_MITER) {
        local_690.value = local_690.value * local_69c;
      }
      if (fVar22 <= local_690.value) {
        fVar22 = local_690.value;
      }
      (state->extents).x = (state->extents).x - fVar22;
      (state->extents).y = (state->extents).y - fVar22;
      (state->extents).w = (state->extents).w + fVar22 + fVar22;
      (state->extents).h = fVar22 + fVar22 + (state->extents).h;
    }
  }
  else {
    local_658.id.data = (char *)0x0;
    local_658.id.length = 0;
    local_658.type = paint_type_color;
    local_658.color.type = color_type_fixed;
    local_658.color.value = 0xff000000;
    local_658._12_4_ = 0;
    parse_paint(element,9,&local_658);
    _Var9 = apply_paint(state,prVar20,&local_658);
    if (_Var9) {
      local_438[0].value = 1.0;
      parse_number(element,10,&local_438[0].value,true,true);
      peVar19 = element;
      do {
        for (paVar11 = peVar19->attributes; paVar11 != (attribute *)0x0; paVar11 = paVar11->next) {
          if (paVar11->id == 0xb) {
            if (((paVar11->value).length == 7) &&
               (iVar10 = strncmp((paVar11->value).data,"inherit",7), iVar10 == 0)) {
              bVar21 = true;
            }
            else {
              bVar21 = false;
              psVar16 = &paVar11->value;
            }
            if (!bVar21) {
              bVar21 = false;
              goto LAB_001081aa;
            }
            break;
          }
        }
        peVar19 = peVar19->parent;
        bVar21 = true;
LAB_001081aa:
        prVar20 = local_698;
        if (!bVar21) goto LAB_0010821e;
      } while (peVar19 != (element_t *)0x0);
      psVar16 = (string_t *)0x0;
LAB_0010821e:
      winding = PLUTOVG_FILL_RULE_NON_ZERO;
      if (psVar16 != (string_t *)0x0) {
        pcVar2 = psVar16->data;
        sVar3 = psVar16->length;
        pcVar1 = pcVar2 + sVar3;
        if ((long)sVar3 < 1) {
          pcVar13 = "nonzero";
        }
        else {
          sVar14 = 0;
          do {
            pcVar13 = "";
            if (sVar14 == 7) break;
            if (pcVar2[sVar14] != "nonzero"[sVar14]) {
              pcVar13 = "nonzero" + sVar14;
              break;
            }
            sVar14 = sVar14 + 1;
            pcVar13 = "nonzero" + sVar3;
          } while (sVar3 != sVar14);
        }
        if (*pcVar13 != '\0') {
          if (pcVar2 < pcVar1) {
            lVar15 = 0;
            do {
              pcVar13 = "";
              if (lVar15 == 7) break;
              if (pcVar2[lVar15] != "evenodd"[lVar15]) {
                pcVar13 = "evenodd" + lVar15;
                break;
              }
              lVar5 = lVar15 + 1;
              lVar15 = lVar15 + 1;
              pcVar13 = "evenodd" + ((long)pcVar1 - (long)pcVar2);
            } while (pcVar2 + lVar5 != pcVar1);
          }
          else {
            pcVar13 = "evenodd";
          }
          winding = (plutovg_fill_rule_t)(*pcVar13 == '\0');
        }
      }
      plutovg_canvas_set_fill_rule(local_698->canvas,winding);
      plutovg_canvas_set_opacity(prVar20->canvas,local_438[0].value * state->opacity);
      plutovg_canvas_set_matrix(prVar20->canvas,&state->matrix);
      plutovg_canvas_fill_path(prVar20->canvas,prVar20->document->path);
    }
    _Var9 = apply_paint(state,prVar20,&local_678);
    if (_Var9) {
      local_684 = 1.0;
      parse_number(element,0x23,&local_684,true,true);
      local_680.value = 0.0;
      local_680.type = length_type_fixed;
      parse_length(element,0x1f,&local_680,false,true);
      length = local_438;
      memset(length,0,0x408);
      do {
        for (paVar11 = element->attributes; paVar11 != (attribute *)0x0; paVar11 = paVar11->next) {
          if (paVar11->id == 0x1e) {
            if (((paVar11->value).length == 7) &&
               (iVar10 = strncmp((paVar11->value).data,"inherit",7), iVar10 == 0)) {
              bVar21 = true;
            }
            else {
              bVar21 = false;
              psVar16 = &paVar11->value;
            }
            if (!bVar21) {
              bVar21 = false;
              goto LAB_001083ff;
            }
            break;
          }
        }
        element = element->parent;
        bVar21 = true;
LAB_001083ff:
        if (!bVar21) goto LAB_0010841b;
      } while (element != (element_t *)0x0);
      psVar16 = (string_t *)0x0;
LAB_0010841b:
      if (psVar16 != (string_t *)0x0) {
        local_638[0] = (byte *)psVar16->data;
        if (0 < (long)psVar16->length) {
          end = local_638[0] + psVar16->length;
          do {
            if ((0x7f < local_38) ||
               (_Var9 = parse_length_value((char **)local_638,(char *)end,local_438 + local_38,false
                                          ), !_Var9)) break;
            bVar21 = local_638[0] < end;
            pbVar12 = local_638[0];
            if (bVar21) {
              if (((ulong)*local_638[0] < 0x2d) &&
                 ((0x100100002600U >> ((ulong)*local_638[0] & 0x3f) & 1) != 0)) {
                bVar21 = true;
                do {
                  pbVar12 = local_638[0];
                  if ((0x20 < (ulong)*local_638[0]) ||
                     ((0x100002600U >> ((ulong)*local_638[0] & 0x3f) & 1) == 0)) break;
                  local_638[0] = local_638[0] + 1;
                  bVar21 = local_638[0] < end;
                  pbVar12 = end;
                } while (local_638[0] != end);
                goto LAB_001084c4;
              }
            }
            else {
LAB_001084c4:
              local_638[0] = pbVar12;
              if (bVar21) {
                bVar21 = false;
                if (pbVar12 < end) {
                  bVar21 = *pbVar12 == 0x2c;
                  pbVar12 = pbVar12 + bVar21;
                }
                local_638[0] = pbVar12;
                if ((bVar21) && (pbVar12 < end)) {
                  while (local_638[0] = pbVar12, (ulong)*pbVar12 < 0x21) {
                    if (((0x100002600U >> ((ulong)*pbVar12 & 0x3f) & 1) == 0) ||
                       (pbVar12 = pbVar12 + 1, local_638[0] = end, pbVar12 == end)) break;
                  }
                }
              }
            }
            local_38 = local_38 + 1;
          } while (local_638[0] < end);
        }
      }
      uVar8 = local_38;
      if (local_38 != 0) {
        uVar18 = 0;
        do {
          fVar22 = resolve_length(state,length,'o');
          (&local_438[-0x40].value)[uVar18] = fVar22;
          uVar18 = uVar18 + 1;
          length = length + 1;
        } while (uVar8 != uVar18);
      }
      prVar20 = local_698;
      ppVar4 = local_698->canvas;
      lVar6 = local_680.type;
      fVar22 = 0.0;
      if (local_680.type == length_type_percent) {
        fVar22 = hypotf(state->view_width,state->view_height);
        fVar22 = fVar22 / 1.4142135;
      }
      fVar23 = local_680.value;
      if (lVar6 == length_type_percent) {
        fVar23 = (fVar22 * local_680.value) / 100.0;
      }
      plutovg_canvas_set_dash_offset(ppVar4,fVar23);
      plutovg_canvas_set_dash_array(prVar20->canvas,(float *)local_638,(int)uVar8);
      ppVar4 = prVar20->canvas;
      lVar6 = local_690.type;
      fVar22 = 0.0;
      if (local_690.type == length_type_percent) {
        fVar22 = hypotf(state->view_width,state->view_height);
        fVar22 = fVar22 / 1.4142135;
      }
      fVar23 = local_690.value;
      if (lVar6 == length_type_percent) {
        fVar23 = (fVar22 * local_690.value) / 100.0;
      }
      plutovg_canvas_set_line_width(ppVar4,fVar23);
      plutovg_canvas_set_line_cap(prVar20->canvas,local_6a0);
      plutovg_canvas_set_line_join(prVar20->canvas,line_join);
      plutovg_canvas_set_miter_limit(prVar20->canvas,local_69c);
      plutovg_canvas_set_opacity(prVar20->canvas,local_684 * state->opacity);
      plutovg_canvas_set_matrix(prVar20->canvas,&state->matrix);
      plutovg_canvas_stroke_path(prVar20->canvas,prVar20->document->path);
    }
  }
  return;
}

Assistant:

static void draw_shape(const element_t* element, const render_context_t* context, render_state_t* state)
{
    paint_t stroke = {paint_type_none};
    parse_paint(element, ATTR_STROKE, &stroke);

    length_t stroke_width = {1.f, length_type_fixed};
    plutovg_line_cap_t line_cap = PLUTOVG_LINE_CAP_BUTT;
    plutovg_line_join_t line_join = PLUTOVG_LINE_JOIN_MITER;
    float miter_limit = 4.f;

    if(stroke.type > paint_type_none) {
        parse_length(element, ATTR_STROKE_WIDTH, &stroke_width, false, true);
        parse_line_cap(element, ATTR_STROKE_LINECAP, &line_cap);
        parse_line_join(element, ATTR_STROKE_LINEJOIN, &line_join);
        parse_number(element, ATTR_STROKE_MITERLIMIT, &miter_limit, false, true);
    }

    if(state->mode == render_mode_bounding) {
        if(stroke.type == paint_type_none)
            return;
        float line_width = resolve_length(state, &stroke_width, 'o');
        float cap_limit = line_width / 2.f;
        if(line_cap == PLUTOVG_LINE_CAP_SQUARE)
            cap_limit *= PLUTOVG_SQRT2;
        float join_limit = line_width / 2.f;
        if(line_join == PLUTOVG_LINE_JOIN_MITER) {
            join_limit *= miter_limit;
        }

        float delta = MAX(cap_limit, join_limit);
        state->extents.x -= delta;
        state->extents.y -= delta;
        state->extents.w += delta * 2.f;
        state->extents.h += delta * 2.f;
        return;
    }

    paint_t fill = {paint_type_color, {color_type_fixed, 0xFF000000}};
    parse_paint(element, ATTR_FILL, &fill);

    if(apply_paint(state, context, &fill)) {
        float fill_opacity = 1.f;
        parse_number(element, ATTR_FILL_OPACITY, &fill_opacity, true, true);

        plutovg_fill_rule_t fill_rule = PLUTOVG_FILL_RULE_NON_ZERO;
        parse_fill_rule(element, ATTR_FILL_RULE, &fill_rule);

        plutovg_canvas_set_fill_rule(context->canvas, fill_rule);
        plutovg_canvas_set_opacity(context->canvas, fill_opacity * state->opacity);
        plutovg_canvas_set_matrix(context->canvas, &state->matrix);
        plutovg_canvas_fill_path(context->canvas, context->document->path);
    }

    if(apply_paint(state, context, &stroke)) {
        float stroke_opacity = 1.f;
        parse_number(element, ATTR_STROKE_OPACITY, &stroke_opacity, true, true);

        length_t dash_offset = {0.f, length_type_fixed};
        parse_length(element, ATTR_STROKE_DASHOFFSET, &dash_offset, false, true);

        stroke_dash_array_t dash_array = {0};
        parse_dash_array(element, ATTR_STROKE_DASHARRAY, &dash_array);

        float dashes[MAX_DASHES];
        for(int i = 0; i < dash_array.size; ++i) {
            dashes[i] = resolve_length(state, dash_array.data + i, 'o');
        }

        plutovg_canvas_set_dash_offset(context->canvas, resolve_length(state, &dash_offset, 'o'));
        plutovg_canvas_set_dash_array(context->canvas, dashes, dash_array.size);

        plutovg_canvas_set_line_width(context->canvas, resolve_length(state, &stroke_width, 'o'));
        plutovg_canvas_set_line_cap(context->canvas, line_cap);
        plutovg_canvas_set_line_join(context->canvas, line_join);
        plutovg_canvas_set_miter_limit(context->canvas, miter_limit);
        plutovg_canvas_set_opacity(context->canvas, stroke_opacity * state->opacity);
        plutovg_canvas_set_matrix(context->canvas, &state->matrix);
        plutovg_canvas_stroke_path(context->canvas, context->document->path);
    }
}